

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O2

void __thiscall cmServer::StartShutDown(cmServer *this)

{
  cmFileMonitor *this_00;
  
  this_00 = (this->fileMonitor).super___shared_ptr<cmFileMonitor,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (this_00 != (cmFileMonitor *)0x0) {
    cmFileMonitor::StopMonitoring(this_00);
    std::__shared_ptr<cmFileMonitor,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->fileMonitor).super___shared_ptr<cmFileMonitor,_(__gnu_cxx::_Lock_policy)2>);
  }
  cmServerBase::StartShutDown(&this->super_cmServerBase);
  return;
}

Assistant:

void cmServer::StartShutDown()
{
  if (fileMonitor) {
    fileMonitor->StopMonitoring();
    fileMonitor.reset();
  }
  cmServerBase::StartShutDown();
}